

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void calculate_fake_group_size_and_set(Am_Object *fake_group,Am_Value_List *list)

{
  int local_64;
  int wh;
  Am_Value_List local_48;
  Am_Object local_38;
  Am_Object owner;
  int top_offset;
  int left_offset;
  int max_bottom;
  int max_right;
  int min_top;
  int min_left;
  Am_Value_List *list_local;
  Am_Object *fake_group_local;
  
  max_right = 29999;
  max_bottom = 29999;
  left_offset = -29999;
  top_offset = -29999;
  _min_top = list;
  list_local = (Am_Value_List *)fake_group;
  Am_Object::Am_Object(&local_38);
  Am_Value_List::Am_Value_List(&local_48,_min_top);
  calculate_group_size(&local_48,&max_right,&max_bottom,&left_offset,&top_offset,&local_38);
  Am_Value_List::~Am_Value_List(&local_48);
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffa0,(Am_Slot_Flags)list_local);
  Am_Translate_Coordinates
            (&local_38,0,0,(Am_Object *)&stack0xffffffffffffffa0,(int *)((long)&owner.data + 4),
             (int *)&owner);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa0);
  Am_Object::Set((Am_Object *)list_local,100,max_right + owner.data._4_4_,0);
  Am_Object::Set((Am_Object *)list_local,0x65,max_bottom + (int)owner.data,0);
  local_64 = left_offset - max_right;
  if (local_64 == 0) {
    local_64 = 1;
  }
  Am_Object::Set((Am_Object *)list_local,0x66,local_64,0);
  local_64 = top_offset - max_bottom;
  if (local_64 == 0) {
    local_64 = 1;
  }
  Am_Object::Set((Am_Object *)list_local,0x67,local_64,0);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

void
calculate_fake_group_size_and_set(Am_Object &fake_group, Am_Value_List &list)
{
  int min_left = 29999;
  int min_top = 29999;
  int max_right = -29999;
  int max_bottom = -29999;
  int left_offset, top_offset;
  Am_Object owner;
  calculate_group_size(list, min_left, min_top, max_right, max_bottom, owner);
  Am_Translate_Coordinates(owner, 0, 0, fake_group.Get_Owner(), left_offset,
                           top_offset);
  fake_group.Set(Am_LEFT, min_left + left_offset);
  fake_group.Set(Am_TOP, min_top + top_offset);
  int wh = max_right - min_left;
  if (wh == 0)
    wh = 1;
  fake_group.Set(Am_WIDTH, wh);
  wh = max_bottom - min_top;
  if (wh == 0)
    wh = 1;
  fake_group.Set(Am_HEIGHT, wh);
  //std::cout << "Calculate fake group " << fake_group << " size = " << min_left
  // << "," << min_top << "," << max_right - min_left << ","
  // << max_bottom - min_top <<std::endl <<std::flush;
}